

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

void arg_print_glossary(FILE *fp,void **argtable,char *format)

{
  undefined8 uVar1;
  char *local_120;
  char *glossary;
  char *datatype;
  char *longopts;
  char *shortopts;
  char syntax [200];
  int tabindex;
  arg_hdr **table;
  char *format_local;
  void **argtable_local;
  FILE *fp_local;
  
  local_120 = format;
  if (format == (char *)0x0) {
    local_120 = "  %-20s %s\n";
  }
  syntax[0xc4] = '\0';
  syntax[0xc5] = '\0';
  syntax[0xc6] = '\0';
  syntax[199] = '\0';
  while ((*argtable[(int)syntax._196_4_] & 1) == 0) {
    if (*(long *)((long)argtable[(int)syntax._196_4_] + 0x20) != 0) {
      memset(&shortopts,0,200);
      uVar1 = *(undefined8 *)((long)argtable[(int)syntax._196_4_] + 0x20);
      arg_cat_optionv((char *)&shortopts,200,*(char **)((long)argtable[(int)syntax._196_4_] + 8),
                      *(char **)((long)argtable[(int)syntax._196_4_] + 0x10),
                      *(char **)((long)argtable[(int)syntax._196_4_] + 0x18),
                      (int)*argtable[(int)syntax._196_4_] & 4,", ");
      fprintf((FILE *)fp,local_120,&shortopts,uVar1);
    }
    syntax._196_4_ = syntax._196_4_ + 1;
  }
  return;
}

Assistant:

void arg_print_glossary(FILE * fp, void * *argtable, const char * format) {
	struct arg_hdr * *table = (struct arg_hdr * *)argtable;
	int tabindex;

	format = format ? format : "  %-20s %s\n";

	for (tabindex = 0; !(table[tabindex]->flag & ARG_TERMINATOR); tabindex++) {
		if (table[tabindex]->glossary) {
			char syntax[200] = "";
			const char * shortopts = table[tabindex]->shortopts;
			const char * longopts  = table[tabindex]->longopts;
			const char * datatype  = table[tabindex]->datatype;
			const char * glossary  = table[tabindex]->glossary;
			arg_cat_optionv(syntax,
							sizeof(syntax),
							shortopts,
							longopts,
							datatype,
							table[tabindex]->flag & ARG_HASOPTVALUE,
							", ");
			fprintf(fp, format, syntax, glossary);
		}
	}
}